

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O3

void __thiscall kratos::DebugInfoVisitor::visit(DebugInfoVisitor *this,FunctionStmtBlock *stmt)

{
  if (((stmt->super_StmtBlock).super_Stmt.super_IRNode.fn_name_ln.
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       *(pointer *)
        ((long)&(stmt->super_StmtBlock).super_Stmt.super_IRNode.fn_name_ln.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data + 8)) &&
     ((stmt->super_StmtBlock).super_Stmt.super_IRNode.verilog_ln != 0)) {
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>,std::_Select1st<std::pair<unsigned_int_const,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>>>
    ::
    _M_emplace_unique<unsigned_int&,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>&>
              ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>,std::_Select1st<std::pair<unsigned_int_const,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>>>
                *)&this->result_,&(stmt->super_StmtBlock).super_Stmt.super_IRNode.verilog_ln,
               &(stmt->super_StmtBlock).super_Stmt.super_IRNode.fn_name_ln);
    return;
  }
  return;
}

Assistant:

void inline visit(FunctionStmtBlock *stmt) override { add_info(stmt); }